

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-bool.cpp
# Opt level: O2

bool __thiscall BoolLinearLE<0>::propagate(BoolLinearLE<0> *this)

{
  int iVar1;
  BoolView *pBVar2;
  int iVar3;
  IntVar *pIVar4;
  uint i;
  ulong uVar5;
  long lVar6;
  
  pIVar4 = (this->y).var;
  iVar1 = (pIVar4->max).v;
  iVar3 = (this->ones).v;
  if (iVar1 < iVar3) {
    Tint::operator=(&this->ones,iVar1 + 1);
    iVar3 = (this->ones).v;
    pIVar4 = (this->y).var;
  }
  if ((pIVar4->min).v < iVar3) {
    iVar3 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0xe])
                      (pIVar4,(long)iVar3,(ulong)(uint)(this->super_Propagator).prop_id << 0x20 | 5,
                       1);
    if ((char)iVar3 == '\0') {
      return false;
    }
    iVar3 = (this->ones).v;
  }
  if (iVar3 == iVar1) {
    lVar6 = 0;
    for (uVar5 = 0; uVar5 < (this->x).sz; uVar5 = uVar5 + 1) {
      pBVar2 = (this->x).data;
      if (sat.assigns.data[*(uint *)((long)&pBVar2->v + lVar6)] == '\0') {
        BoolView::setVal2((BoolView *)
                          ((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar6),false
                          ,(Reason)(((ulong)(uint)(this->super_Propagator).prop_id << 0x20) + 1));
      }
      lVar6 = lVar6 + 0x10;
    }
  }
  return true;
}

Assistant:

bool propagate() override {
		const int y_max = static_cast<int>(y.getMax());

		if (ones > y_max) {
			ones = y_max + 1;
		}

		setDom2(y, setMin, ones, 1);

		if (ones == y_max) {
			for (unsigned int i = 0; i < x.size(); i++) {
				if (!x[i].isFixed()) {
					x[i].setVal2(false, Reason(prop_id, 0));
				}
			}
		}

		return true;
	}